

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
hta::storage::file::Directory::metric_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Directory *this)

{
  bool bVar1;
  directory_entry *this_00;
  iterator __first;
  iterator __last;
  path local_b8;
  path *local_90;
  path *path;
  undefined1 local_78 [8];
  directory_iterator __end2;
  undefined1 local_58 [8];
  directory_iterator __begin2;
  directory_iterator local_38;
  directory_iterator *local_28;
  directory_iterator *__range2;
  Directory *local_18;
  Directory *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  __range2._7_1_ = 0;
  local_18 = this;
  this_local = (Directory *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&local_38,&this->directory_);
  local_28 = &local_38;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end2._M_dir._M_refcount,local_28);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_58,(directory_iterator *)&__end2._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end2._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&path,local_28);
  std::filesystem::__cxx11::end((directory_iterator *)local_78);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&path);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_58,(directory_iterator *)local_78), bVar1) {
    this_00 = (directory_entry *)
              std::filesystem::__cxx11::directory_iterator::operator*
                        ((directory_iterator *)local_58);
    local_90 = std::filesystem::__cxx11::directory_entry::operator_cast_to_path_(this_00);
    bVar1 = std::filesystem::is_directory(local_90);
    if (bVar1) {
      std::filesystem::__cxx11::path::filename(&local_b8,local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<std::filesystem::__cxx11::path>(__return_storage_ptr__,&local_b8);
      std::filesystem::__cxx11::path::~path(&local_b8);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_58);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_78);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_58);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_38);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(__return_storage_ptr__);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Directory::metric_names()
{
    std::vector<std::string> result;
    for (const std::filesystem::path& path : std::filesystem::directory_iterator(directory_))
    {
        if (std::filesystem::is_directory(path))
        {
            result.emplace_back(path.filename());
        }
    }
    std::sort(result.begin(), result.end());
    return result;
}